

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# workspace_pool.cc
# Opt level: O2

void __thiscall tvm::runtime::WorkspacePool::Pool::Free(Pool *this,void *data)

{
  vector<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
  *this_00;
  pointer pEVar1;
  pointer pEVar2;
  undefined8 uVar3;
  size_t sVar4;
  uint uVar5;
  ostream *poVar6;
  undefined8 *puVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  int in_stack_fffffffffffffe38;
  int in_stack_fffffffffffffe3c;
  LogCheckError _check_err;
  Entry e;
  LogMessageFatal local_1a8;
  
  pEVar1 = (this->allocated_).
           super__Vector_base<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pEVar1[-1].data == data) {
    e.data = pEVar1[-1].data;
    e.size = pEVar1[-1].size;
    (this->allocated_).
    super__Vector_base<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
    ._M_impl.super__Vector_impl_data._M_finish = pEVar1 + -1;
  }
  else {
    this_00 = &this->allocated_;
    pEVar2 = (this_00->
             super__Vector_base<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar5 = (int)((ulong)((long)pEVar1 - (long)pEVar2) >> 4) - 2;
    uVar8 = (int)uVar5 >> 0x1f & uVar5;
    while ((uVar9 = uVar8, 0 < (int)uVar5 && (uVar9 = uVar5, pEVar2[uVar5].data != data))) {
      uVar5 = uVar5 - 1;
    }
    dmlc::LogCheck_GT(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
    if (_check_err.str != (string *)0x0) {
      dmlc::LogMessageFatal::LogMessageFatal
                (&local_1a8,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/src/runtime/workspace_pool.cc"
                 ,99);
      poVar6 = std::operator<<((ostream *)&local_1a8,"Check failed: ");
      poVar6 = std::operator<<(poVar6,"index > 0");
      poVar6 = std::operator<<(poVar6,(string *)_check_err.str);
      poVar6 = std::operator<<(poVar6,": ");
      std::operator<<(poVar6,"trying to free things that has not been allocated");
      dmlc::LogMessageFatal::~LogMessageFatal(&local_1a8);
    }
    dmlc::LogCheckError::~LogCheckError(&_check_err);
    pEVar2 = (this_00->
             super__Vector_base<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pEVar1 = pEVar2 + (int)uVar9;
    e.data = pEVar1->data;
    e.size = pEVar1->size;
    std::
    vector<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
    ::erase(this_00,pEVar2 + (int)uVar9);
  }
  sVar4 = e.size;
  pEVar1 = (this->free_list_).
           super__Vector_base<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pEVar1[-1].size < e.size) {
    std::
    vector<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
    ::push_back(&this->free_list_,&e);
  }
  else {
    lVar10 = (long)pEVar1 -
             (long)(this->free_list_).
                   super__Vector_base<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    if (lVar10 == 0x20) {
      std::
      vector<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
      ::push_back(&this->free_list_,pEVar1 + -1);
      pEVar1 = (this->free_list_).
               super__Vector_base<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pEVar1[1].data = e.data;
      pEVar1[1].size = e.size;
    }
    else {
      std::
      vector<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
      ::resize(&this->free_list_,(lVar10 >> 4) + 1);
      for (; pEVar1 = (this->free_list_).
                      super__Vector_base<tvm::runtime::WorkspacePool::Pool::Entry,_std::allocator<tvm::runtime::WorkspacePool::Pool::Entry>_>
                      ._M_impl.super__Vector_impl_data._M_start,
          sVar4 < *(ulong *)((long)pEVar1 + lVar10 + -8); lVar10 = lVar10 + -0x10) {
        puVar7 = (undefined8 *)((long)&pEVar1->data + lVar10);
        uVar3 = *(undefined8 *)((long)pEVar1 + lVar10 + -8);
        *puVar7 = *(undefined8 *)((long)&pEVar1[-1].data + lVar10);
        puVar7[1] = uVar3;
      }
      puVar7 = (undefined8 *)((long)&pEVar1->data + lVar10);
      *puVar7 = e.data;
      puVar7[1] = e.size;
    }
  }
  return;
}

Assistant:

void Free(void *data) {
    Entry e;
    if (allocated_.back().data == data) {
      // quick path, last allocated.
      e = allocated_.back();
      allocated_.pop_back();
    } else {
      int index = static_cast<int>(allocated_.size()) - 2;
      for (; index > 0 && allocated_[index].data != data; --index) {
      }
      CHECK_GT(index, 0) << "trying to free things that has not been allocated";
      e = allocated_[index];
      allocated_.erase(allocated_.begin() + index);
    }
    if (free_list_.back().size < e.size) {
      free_list_.push_back(e);
    } else if (free_list_.size() == 2) {
      free_list_.push_back(free_list_.back());
      free_list_[1] = e;
    } else {
      size_t i = free_list_.size() - 1;
      free_list_.resize(free_list_.size() + 1);
      for (; e.size < free_list_[i].size; --i) {
        free_list_[i + 1] = free_list_[i];
      }
      free_list_[i + 1] = e;
    }
  }